

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_nullddi.cpp
# Opt level: O0

ze_result_t __thiscall
driver::zesDriverGetDeviceByUuidExp
          (driver *this,zes_driver_handle_t hDriver,zes_uuid_t uuid,zes_device_handle_t *phDevice,
          ze_bool_t *onSubdevice,uint32_t *subdeviceId)

{
  void *pvVar1;
  zes_pfnDriverGetDeviceByUuidExp_t pfnGetDeviceByUuidExp;
  ze_result_t result;
  uint32_t *subdeviceId_local;
  ze_bool_t *onSubdevice_local;
  zes_device_handle_t *phDevice_local;
  zes_driver_handle_t hDriver_local;
  zes_uuid_t uuid_local;
  
  pfnGetDeviceByUuidExp._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011cb28 == (code *)0x0) {
    pvVar1 = context_t::get((context_t *)&context);
    *uuid.id._8_8_ = pvVar1;
  }
  else {
    pfnGetDeviceByUuidExp._4_4_ =
         (*DAT_0011cb28)(this,hDriver,uuid.id._0_8_,uuid.id._8_8_,phDevice,onSubdevice);
  }
  return pfnGetDeviceByUuidExp._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesDriverGetDeviceByUuidExp(
        zes_driver_handle_t hDriver,                    ///< [in] handle of the sysman driver instance
        zes_uuid_t uuid,                                ///< [in] universal unique identifier.
        zes_device_handle_t* phDevice,                  ///< [out] Sysman handle of the device.
        ze_bool_t* onSubdevice,                         ///< [out] True if the UUID belongs to the sub-device; false means that
                                                        ///< UUID belongs to the root device.
        uint32_t* subdeviceId                           ///< [out] If onSubdevice is true, this gives the ID of the sub-device
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGetDeviceByUuidExp = context.zesDdiTable.DriverExp.pfnGetDeviceByUuidExp;
        if( nullptr != pfnGetDeviceByUuidExp )
        {
            result = pfnGetDeviceByUuidExp( hDriver, uuid, phDevice, onSubdevice, subdeviceId );
        }
        else
        {
            // generic implementation
            *phDevice = reinterpret_cast<zes_device_handle_t>( context.get() );

        }

        return result;
    }